

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O2

void __thiscall leveldb::DBImpl::RecordReadSample(DBImpl *this,Slice key)

{
  long lVar1;
  bool bVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::mutex::lock(&(this->mutex_).mu_);
  bVar2 = Version::RecordReadSample(this->versions_->current_,key);
  if (bVar2) {
    MaybeScheduleCompaction(this);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void DBImpl::RecordReadSample(Slice key) {
  MutexLock l(&mutex_);
  if (versions_->current()->RecordReadSample(key)) {
    MaybeScheduleCompaction();
  }
}